

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::~cmLocalNinjaGenerator(cmLocalNinjaGenerator *this)

{
  cmLocalNinjaGenerator *this_local;
  
  ~cmLocalNinjaGenerator(this);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

cmLocalNinjaGenerator::~cmLocalNinjaGenerator()
{
}